

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O2

knote * knote_index_RB_FIND(knote_index *head,knote *elm)

{
  knote *pkVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  while( true ) {
    pkVar1 = head->rbh_root;
    if ((pkVar1 == (knote *)0x0) ||
       ((uVar2 = (elm->kev).ident, uVar3 = (pkVar1->kev).ident, uVar4 = (uint)(uVar2 < uVar3),
        uVar6 = (uint)(uVar2 >= uVar3 && uVar2 != uVar3), lVar5 = 0x38, -1 < (int)(uVar6 - uVar4) &&
        (lVar5 = 0x40, uVar6 == uVar4)))) break;
    head = (knote_index *)((long)&(pkVar1->kev).ident + lVar5);
  }
  return pkVar1;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}